

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O0

_Bool object_has_rune(object *obj,wchar_t rune_no)

{
  rune *prVar1;
  _Bool _Var2;
  int iVar3;
  wchar_t local_30;
  int local_2c;
  wchar_t i_1;
  wchar_t i;
  rune *r;
  wchar_t rune_no_local;
  object *obj_local;
  
  prVar1 = rune_list + rune_no;
  switch(prVar1->variety) {
  case RUNE_VAR_COMBAT:
    if ((prVar1->index == 0) && (obj->to_a != 0)) {
      return true;
    }
    if ((prVar1->index == 1) && (_Var2 = object_has_standard_to_h(obj), !_Var2)) {
      return true;
    }
    if ((prVar1->index == 2) && (obj->to_d != 0)) {
      return true;
    }
    if ((prVar1->index == 3) && (_Var2 = object_has_standard_ac(obj), !_Var2)) {
      return true;
    }
    if ((prVar1->index == 4) && (_Var2 = object_has_standard_dice(obj), !_Var2)) {
      return true;
    }
    break;
  case RUNE_VAR_MOD:
    if (obj->modifiers[prVar1->index] != 0) {
      return true;
    }
    break;
  case RUNE_VAR_RESIST:
    if (obj->el_info[prVar1->index].res_level != 100) {
      return true;
    }
    break;
  case RUNE_VAR_BRAND:
    if (obj->brands != (_Bool *)0x0) {
      for (local_2c = 0; local_2c < (int)(uint)z_info->brand_max; local_2c = local_2c + 1) {
        if (((obj->brands[local_2c] & 1U) != 0) &&
           (iVar3 = strcmp(brands[local_2c].name,prVar1->name), iVar3 == 0)) {
          return true;
        }
      }
    }
    break;
  case RUNE_VAR_SLAY:
    if (obj->slays != (_Bool *)0x0) {
      for (local_30 = L'\0'; local_30 < (int)(uint)z_info->slay_max; local_30 = local_30 + L'\x01')
      {
        if (((obj->slays[local_30] & 1U) != 0) &&
           (_Var2 = same_monsters_slain(prVar1->index,local_30), _Var2)) {
          return true;
        }
      }
    }
    break;
  case RUNE_VAR_CURSE:
    if ((obj->curses != (curse_data *)0x0) && (obj->curses[prVar1->index].power != L'\0')) {
      return true;
    }
    break;
  case RUNE_VAR_FLAG:
    _Var2 = flag_has_dbg(obj->flags,6,prVar1->index,"obj->flags","r->index");
    if (_Var2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool object_has_rune(const struct object *obj, int rune_no)
{
	struct rune *r = &rune_list[rune_no];

	switch (r->variety) {
		/* Combat runes - just check them all */
		case RUNE_VAR_COMBAT: {
			if ((r->index == COMBAT_RUNE_TO_A) && (obj->to_a))
				return true;
			else if ((r->index == COMBAT_RUNE_TO_H) &&
					 !object_has_standard_to_h(obj))
				return true;
			else if ((r->index == COMBAT_RUNE_TO_D) && (obj->to_d))
				return true;
			else if ((r->index == COMBAT_RUNE_AC) &&
					 !object_has_standard_ac(obj))
				return true;
			else if ((r->index == COMBAT_RUNE_DICE) &&
					 !object_has_standard_dice(obj))
				return true;
			break;
		}
		/* Mod runes */
		case RUNE_VAR_MOD: {
			if (obj->modifiers[r->index] != 0)
				return true;
			break;
		}
		/* Element runes */
		case RUNE_VAR_RESIST: {
			if (obj->el_info[r->index].res_level != RES_LEVEL_BASE)
				return true;
			break;
		}
		/* Brand runes */
		case RUNE_VAR_BRAND: {
			if (obj->brands) {
				int i;
				for (i = 0; i < z_info->brand_max; i++) {
					if (obj->brands[i] && streq(brands[i].name, r->name)) {
						return true;
					}
				}
			}
			break;
		}
		/* Slay runes */
		case RUNE_VAR_SLAY: {
			if (obj->slays) {
				int i;
				for (i = 0; i < z_info->slay_max; i++) {
					if (obj->slays[i] && same_monsters_slain(r->index, i)) {
						return true;
					}
				}
			}
			break;
		}
		/* Curse runes */
		case RUNE_VAR_CURSE: {
			if (obj->curses && obj->curses[r->index].power)
				return true;
			break;
		}
		/* Flag runes */
		case RUNE_VAR_FLAG: {
			if (of_has(obj->flags, r->index))
				return true;
			break;
		}
		default: break;
	}

	return false;
}